

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_move16_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  uint32_t uVar1;
  TCGTemp *a1;
  TCGv_i32 *ppTVar2;
  uintptr_t o;
  TCGv_i32 *ppTVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uintptr_t o_1;
  TCGv_i32 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar4 = ((s->base).tb)->flags;
  uVar1 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  if (-1 < (short)uVar1) {
    gen_exception(s,(s->base).pc_next,4);
  }
  uVar7 = uVar1 >> 0xc & 7;
  uVar6 = 1 << (sbyte)uVar7;
  if (((uint)s->writeback_mask >> uVar7 & 1) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  uVar5 = insn & 7;
  if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
  }
  m68k_copy_line(tcg_ctx,ppTVar2[uVar7],ppTVar3[uVar5],(uint)((uVar4 >> 0xd & 1) == 0));
  a1 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  arg1 = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  uVar4 = s->writeback_mask;
  if ((uVar4 & uVar6) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  if (ppTVar2[uVar7] != arg1) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)a1,(TCGArg)(ppTVar2[uVar7] + (long)tcg_ctx));
    uVar4 = s->writeback_mask;
  }
  if ((uVar4 & 1 << (sbyte)uVar5) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[uVar5],ppTVar2[uVar5],0x10);
  if ((s->writeback_mask & uVar6) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[uVar7],arg1,0x10);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(move16_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv tmp;
    uint16_t ext;

    ext = read_im16(env, s);
    if ((ext & (1 << 15)) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
    }

    m68k_copy_line(tcg_ctx, AREG(ext, 12), AREG(insn, 0), index);

    /* Ax can be Ay, so save Ay before incrementing Ax */
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, tmp, AREG(ext, 12));
    tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), AREG(insn, 0), 16);
    tcg_gen_addi_i32(tcg_ctx, AREG(ext, 12), tmp, 16);
    tcg_temp_free(tcg_ctx, tmp);
}